

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_scanline_chunk_info(exr_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  exr_priv_part_t part;
  exr_chunk_info_t nil;
  int cidx;
  int miny;
  int lpc;
  exr_attr_box2i_t dw;
  exr_const_context_t in_stack_ffffffffffffff80;
  exr_const_priv_part_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_3c;
  int local_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  exr_result_t local_4;
  
  memset(&stack0xffffffffffffff80,0,0x40);
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffff80);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffff80);
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RCX == (int *)0x0) {
        internal_exr_unlock(in_stack_ffffffffffffff80);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if ((*(int *)(lVar1 + 4) == 1) || (*(int *)(lVar1 + 4) == 3)) {
        internal_exr_unlock(in_stack_ffffffffffffff80);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x12);
      }
      else if (*in_RDI == '\x03') {
        uVar2 = *(undefined8 *)(lVar1 + 0x90);
        uVar3 = *(undefined8 *)(lVar1 + 0x98);
        iStack_2c = (int)((ulong)uVar2 >> 0x20);
        iStack_24 = (int)((ulong)uVar3 >> 0x20);
        if ((in_EDX < iStack_2c) || (iStack_24 < in_EDX)) {
          internal_exr_unlock(in_stack_ffffffffffffff80);
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,
                               "Invalid request for scanline %d outside range of data window (%d - %d)"
                               ,in_EDX,iStack_2c,iStack_24);
        }
        else {
          iVar4 = (int)*(short *)(lVar1 + 0xf0);
          local_3c = in_EDX - iStack_2c;
          if (1 < iVar4) {
            local_3c = local_3c / iVar4;
          }
          iVar5 = local_3c * iVar4 + iStack_2c;
          if ((local_3c < 0) || (*(int *)(lVar1 + 0xf4) <= local_3c)) {
            internal_exr_unlock(in_stack_ffffffffffffff80);
            local_4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,
                                 "Invalid request for scanline %d in chunk %d outside chunk count %d"
                                 ,in_EDX,local_3c,*(undefined4 *)(lVar1 + 0xf4));
          }
          else {
            memcpy(in_RCX,&stack0xffffffffffffff80,0x40);
            *in_RCX = local_3c;
            *(char *)((long)in_RCX + 0x16) = (char)*(undefined4 *)(lVar1 + 4);
            *(char *)((long)in_RCX + 0x17) = (char)*(undefined4 *)(lVar1 + 0xb0);
            local_30 = (int)uVar2;
            in_RCX[1] = local_30;
            in_RCX[2] = iVar5;
            local_28 = (int)uVar3;
            in_RCX[4] = (local_28 - local_30) + 1;
            in_RCX[3] = iVar4;
            if (iVar5 < iStack_2c) {
              in_RCX[2] = iStack_2c;
              in_RCX[3] = in_RCX[3] - (iStack_2c - iVar5);
            }
            else if (iStack_24 < iVar5 + iVar4) {
              in_RCX[3] = (iStack_24 - iVar5) + 1;
            }
            *(undefined1 *)(in_RCX + 5) = 0;
            *(undefined1 *)((long)in_RCX + 0x15) = 0;
            in_RCX[0xc] = 0;
            in_RCX[0xd] = 0;
            in_RCX[0xe] = 0;
            in_RCX[0xf] = 0;
            in_RCX[6] = 0;
            in_RCX[7] = 0;
            in_RCX[8] = 0;
            in_RCX[9] = 0;
            uVar6 = compute_chunk_unpack_size
                              (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                               in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
            *(uint64_t *)(in_RCX + 10) = uVar6;
            internal_exr_unlock(in_stack_ffffffffffffff80);
            local_4 = 0;
          }
        }
      }
      else if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffff80);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,9);
      }
      else {
        internal_exr_unlock(in_stack_ffffffffffffff80);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_write_scanline_chunk_info (
    exr_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_attr_box2i_t dw;
    int              lpc, miny, cidx;
    exr_chunk_info_t nil = {0};

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (!cinfo)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI));
    }

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y));
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = cidx * lpc + dw.min.y;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count));
    }

    *cinfo             = nil;
    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    cinfo->sample_count_data_offset = 0;
    cinfo->sample_count_table_size  = 0;
    cinfo->data_offset              = 0;
    cinfo->packed_size              = 0;
    cinfo->unpacked_size =
        compute_chunk_unpack_size (dw.min.x, y, cinfo->width, cinfo->height, lpc, part);

    return EXR_UNLOCK_AND_RETURN (EXR_ERR_SUCCESS);
}